

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_4> * tcu::reflect<double,4>(Vector<double,_4> *i,Vector<double,_4> *n)

{
  double dVar1;
  Vector<double,_4> *res_2;
  int i_1;
  long lVar2;
  double res;
  double dVar3;
  Vector<double,_4> res_1;
  
  dVar3 = 0.0;
  lVar2 = 0;
  do {
    dVar3 = dVar3 + n->m_data[lVar2] * i->m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  res_1.m_data[2] = 0.0;
  res_1.m_data[3] = 0.0;
  res_1.m_data[0] = 0.0;
  res_1.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    dVar1 = (n->m_data + lVar2)[1];
    res_1.m_data[lVar2] = n->m_data[lVar2] * (dVar3 + dVar3);
    res_1.m_data[lVar2 + 1] = dVar1 * (dVar3 + dVar3);
    lVar2 = lVar2 + 2;
  } while (lVar2 != 4);
  res_2->m_data[2] = 0.0;
  res_2->m_data[3] = 0.0;
  res_2->m_data[0] = 0.0;
  res_2->m_data[1] = 0.0;
  lVar2 = 0;
  do {
    dVar3 = (i->m_data + lVar2)[1];
    dVar1 = res_1.m_data[lVar2 + 1];
    res_2->m_data[lVar2] = i->m_data[lVar2] - res_1.m_data[lVar2];
    (res_2->m_data + lVar2)[1] = dVar3 - dVar1;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 4);
  return res_2;
}

Assistant:

inline Vector<T, Size> reflect (const Vector<T, Size>& i, const Vector<T, Size>& n)
{
	return i - T(2) * dot(n, i) * n;
}